

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

UChar32 utext_current32_63(UText *ut)

{
  UChar UVar1;
  int iVar2;
  int64_t iVar3;
  UBool UVar4;
  uint uVar5;
  uint uVar6;
  
  if ((ut->chunkOffset == ut->chunkLength) &&
     (UVar4 = (*ut->pFuncs->access)(ut,ut->chunkNativeLimit,'\x01'), UVar4 == '\0')) {
LAB_002d5afd:
    uVar5 = 0xffffffff;
  }
  else {
    iVar2 = ut->chunkOffset;
    UVar1 = ut->chunkContents[iVar2];
    uVar5 = (uint)(ushort)UVar1;
    if ((uVar5 & 0xfc00) != 0xd800) {
      return uVar5;
    }
    if (iVar2 + 1 < ut->chunkLength) {
      uVar6 = (uint)(ushort)ut->chunkContents[(long)iVar2 + 1];
    }
    else {
      iVar3 = ut->chunkNativeLimit;
      UVar4 = (*ut->pFuncs->access)(ut,iVar3,'\x01');
      if (UVar4 == '\0') {
        uVar6 = 0;
      }
      else {
        uVar6 = (uint)(ushort)ut->chunkContents[ut->chunkOffset];
      }
      UVar4 = (*ut->pFuncs->access)(ut,iVar3,'\0');
      ut->chunkOffset = iVar2;
      if (UVar4 == '\0') goto LAB_002d5afd;
    }
    if ((uVar6 & 0xfc00) == 0xdc00) {
      uVar5 = (uint)(ushort)UVar1 * 0x400 + -0x35fdc00 + uVar6;
    }
  }
  return uVar5;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utext_current32(UText *ut) {
    UChar32  c;
    if (ut->chunkOffset==ut->chunkLength) {
        // Current position is just off the end of the chunk.
        if (ut->pFuncs->access(ut, ut->chunkNativeLimit, TRUE) == FALSE) {
            // Off the end of the text.
            return U_SENTINEL;
        }
    }

    c = ut->chunkContents[ut->chunkOffset];
    if (U16_IS_LEAD(c) == FALSE) {
        // Normal, non-supplementary case.
        return c;
    }

    //
    //  Possible supplementary char.
    //
    UChar32   trail = 0;
    UChar32   supplementaryC = c;
    if ((ut->chunkOffset+1) < ut->chunkLength) {
        // The trail surrogate is in the same chunk.
        trail = ut->chunkContents[ut->chunkOffset+1];
    } else {
        //  The trail surrogate is in a different chunk.
        //     Because we must maintain the iteration position, we need to switch forward
        //     into the new chunk, get the trail surrogate, then revert the chunk back to the
        //     original one.
        //     An edge case to be careful of:  the entire text may end with an unpaired
        //        leading surrogate.  The attempt to access the trail will fail, but
        //        the original position before the unpaired lead still needs to be restored.
        int64_t  nativePosition = ut->chunkNativeLimit;
        int32_t  originalOffset = ut->chunkOffset;
        if (ut->pFuncs->access(ut, nativePosition, TRUE)) {
            trail = ut->chunkContents[ut->chunkOffset];
        }
        UBool r = ut->pFuncs->access(ut, nativePosition, FALSE);  // reverse iteration flag loads preceding chunk
        U_ASSERT(r==TRUE);
        ut->chunkOffset = originalOffset;
        if(!r) {
            return U_SENTINEL;
        }
    }

    if (U16_IS_TRAIL(trail)) {
        supplementaryC = U16_GET_SUPPLEMENTARY(c, trail);
    }
    return supplementaryC;

}